

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_modelNotEqualInvalidInput_Test::TestBody(Equality_modelNotEqualInvalidInput_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_88 [2];
  AssertHelper local_68 [8];
  Message local_60 [24];
  shared_ptr<libcellml::Entity> local_48;
  bool local_31;
  undefined1 local_30 [8];
  AssertionResult gtest_ar_;
  ModelPtr m1;
  Equality_modelNotEqualInvalidInput_Test *this_local;
  
  libcellml::Model::create();
  peVar3 = std::__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Model,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&gtest_ar_.message_);
  std::shared_ptr<libcellml::Entity>::shared_ptr(&local_48,(nullptr_t)0x0);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_31 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_30,&local_31,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_48);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar2) {
    testing::Message::Message(local_60);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_88,local_30,"m1->equals(nullptr)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x371,pcVar4);
    testing::internal::AssertHelper::operator=(local_68,local_60);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    std::__cxx11::string::~string((string *)local_88);
    testing::Message::~Message(local_60);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::shared_ptr<libcellml::Model>::~shared_ptr
            ((shared_ptr<libcellml::Model> *)&gtest_ar_.message_);
  return;
}

Assistant:

TEST(Equality, modelNotEqualInvalidInput)
{
    libcellml::ModelPtr m1 = libcellml::Model::create();

    EXPECT_FALSE(m1->equals(nullptr));
}